

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.h
# Opt level: O0

void __thiscall Liby::WeakTimerHolder::WeakTimerHolder(WeakTimerHolder *this,TimerHolder *holder)

{
  Timer *pTVar1;
  uint64_t id;
  Timestamp *timeout;
  shared_ptr<Liby::Timer> local_58 [2];
  function<void_()> local_38;
  TimerHolder *local_18;
  TimerHolder *holder_local;
  WeakTimerHolder *this_local;
  
  local_18 = holder;
  holder_local = (TimerHolder *)this;
  pTVar1 = TimerHolder::getTimer(holder);
  id = Timer::id(pTVar1);
  pTVar1 = TimerHolder::getTimer(local_18);
  timeout = Timer::timeout(pTVar1);
  std::function<void_()>::function(&local_38,(nullptr_t)0x0);
  Timer::Timer(&this->timer_,id,timeout,&local_38);
  std::function<void_()>::~function(&local_38);
  TimerHolder::getTimerPtr((TimerHolder *)local_58);
  std::weak_ptr<Liby::Timer>::weak_ptr<Liby::Timer,void>(&this->weakTimerPtr_,local_58);
  std::shared_ptr<Liby::Timer>::~shared_ptr(local_58);
  return;
}

Assistant:

WeakTimerHolder(const TimerHolder &holder)
        : timer_(holder.getTimer().id(), holder.getTimer().timeout(), nullptr),
          weakTimerPtr_(holder.getTimerPtr()) {}